

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

char * spdlog::details::short_filename_formatter<spdlog::details::null_scoped_padder>::basename
                 (char *__filename)

{
  char *pcVar1;
  char *rv;
  char *local_18;
  
  pcVar1 = strrchr(__filename,0x2f);
  local_18 = __filename;
  if (pcVar1 != (char *)0x0) {
    local_18 = pcVar1 + 1;
  }
  return local_18;
}

Assistant:

static const char *basename(const char *filename)
    {
        // if the size is 2 (1 character + null terminator) we can use the more efficient strrchr
        // the branch will be elided by optimizations
        if (sizeof(os::folder_seps) == 2)
        {
            const char *rv = std::strrchr(filename, os::folder_seps[0]);
            return rv != nullptr ? rv + 1 : filename;
        }
        else
        {
            const std::reverse_iterator<const char *> begin(filename + std::strlen(filename));
            const std::reverse_iterator<const char *> end(filename);

            const auto it = std::find_first_of(begin, end, std::begin(os::folder_seps), std::end(os::folder_seps) - 1);
            return it != end ? it.base() : filename;
        }
    }